

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMMapping.c
# Opt level: O0

_Bool ARM_rel_branch(cs_struct *h,uint id)

{
  int local_20;
  int i;
  uint id_local;
  cs_struct *h_local;
  
  local_20 = 0;
  while( true ) {
    if (insn_rel[local_20] == 0) {
      return false;
    }
    if (id == insn_rel[local_20]) break;
    local_20 = local_20 + 1;
  }
  return true;
}

Assistant:

bool ARM_rel_branch(cs_struct *h, unsigned int id)
{
	int i;

	for (i = 0; insn_rel[i]; i++) {
		if (id == insn_rel[i]) {
			return true;
		}
	}

	// not found
	return false;
}